

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testfonts.cpp
# Opt level: O1

void test_fonts(wins *wins_ar,int ar_len)

{
  undefined8 *puVar1;
  long *plVar2;
  long lVar3;
  Am_Style bs;
  Am_Image_Array local_48 [8];
  long local_40;
  Am_Style local_38 [8];
  
  if (0 < ar_len) {
    local_40 = (ulong)(uint)ar_len << 6;
    lVar3 = 0;
    do {
      puVar1 = *(undefined8 **)((long)&wins_ar->root + lVar3);
      Am_Style::Am_Style(local_38,(Am_Style *)&Am_No_Style);
      plVar2 = (long *)(**(code **)*puVar1)
                                 (puVar1,400,0x32,200,0x23f,"","",1,0,local_38,0,1,1,0,0,1,0,0,1,0);
      Am_Style::~Am_Style(local_38);
      *(long **)((long)&wins_ar->font_win + lVar3) = plVar2;
      (**(code **)(*plVar2 + 0xa0))(plVar2);
      lVar3 = lVar3 + 0x40;
    } while (local_40 != lVar3);
  }
  if (*(int *)(wins_ar->root + 0x54) == 1) {
    Am_Image_Array::Am_Image_Array(local_48,0x32);
    Am_Style::Am_Style((Am_Style *)0x0,0,0,&bs,2,1,0,0,&Am_DEFAULT_DASH_LIST,2,2,0,local_48);
    Am_Image_Array::~Am_Image_Array(local_48);
  }
  else {
    Am_Style::Am_Style(&bs,(Am_Style *)&Am_Red);
  }
  test_font_variety(wins_ar,ar_len,(Am_Style *)&Am_No_Style,false);
  test_font_dimensions(wins_ar,ar_len);
  test_char_dimensions(wins_ar,ar_len);
  test_font_props(wins_ar,ar_len);
  test_bogus_name(wins_ar,ar_len);
  test_filled_and_inverted_text(wins_ar,ar_len,&bs);
  Am_Style::~Am_Style(&bs);
  return;
}

Assistant:

void
test_fonts(wins *wins_ar, int ar_len)

{

  for (int i = 0; i < ar_len; i++) {
    Am_Drawonable *the_font_win =
        (wins_ar[i].root)->Create(400, FONT_WIN_TOP, 200, 575);
    wins_ar[i].font_win = the_font_win;
    the_font_win->Flush_Output();
  }

  // base styles of all screens on the style of the main screen.

  Am_Style bs = (bool)wins_ar[0].root->Is_Color()
                    ? Am_Red
                    : Am_Style(0.0f, 0.0f, 0.0f, 2, Am_CAP_BUTT, Am_JOIN_MITER,
                               Am_LINE_SOLID, Am_DEFAULT_DASH_LIST,
                               Am_DEFAULT_DASH_LIST_LENGTH, Am_FILL_STIPPLED,
                               Am_FILL_POLY_EVEN_ODD, Am_Image_Array(50));

  test_font_variety(wins_ar, ar_len, Am_No_Style, false); // normal text
  //test_font_variety(wins_ar, ar_len, bs, false); // red background rect
  //test_font_variety(wins_ar, ar_len, bs, true); // inverted

  test_font_dimensions(wins_ar, ar_len);
  test_char_dimensions(wins_ar, ar_len);
  test_font_props(wins_ar, ar_len);
  test_bogus_name(wins_ar, ar_len);
  test_filled_and_inverted_text(wins_ar, ar_len, bs);
}